

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_special_functions.cc
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
operator<<(basic_ostream<char,_std::char_traits<char>_> *out,args<double,_2UL> *x)

{
  std::ostream::_M_insert<double>((x->super_array<double,_2UL>)._M_elems[0]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
  std::ostream::_M_insert<double>((x->super_array<double,_2UL>)._M_elems[1]);
  return out;
}

Assistant:

std::basic_ostream<CharT, TraitT> &operator<<(std::basic_ostream<CharT, TraitT> &out,
                                                       const args &x) {
    for (std::size_t i{0}; i < x.size(); ++i) {
      out << x[i];
      if (i + 1 < n)
        out << ", ";
    }
    return out;
  }